

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isBilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths,Vec2 *xBounds,
               Vec2 *yBounds,float cmpReference,float result,bool isFixedPointDepth)

{
  float fVar1;
  float fVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  CmpResultSet CVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  byte bVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  BVec4 cmpTrue;
  Vec4 refVal;
  byte local_ac [3];
  bool local_a9;
  undefined1 local_a8 [16];
  Vec2 *local_98;
  Vec2 *local_90;
  undefined1 local_88 [16];
  float local_78 [8];
  float local_58 [6];
  float local_40 [4];
  
  fVar17 = depths->m_data[1];
  fVar1 = depths->m_data[2];
  fVar2 = depths->m_data[3];
  local_98 = xBounds;
  local_90 = yBounds;
  local_78[4] = result;
  local_88._0_4_ = prec->pcfBits;
  local_a8._0_4_ = cmpReference;
  CVar3 = execCompare(compareMode,depths->m_data[0],cmpReference,prec->referenceBits,
                      isFixedPointDepth);
  CVar4 = execCompare(compareMode,fVar17,(float)local_a8._0_4_,prec->referenceBits,isFixedPointDepth
                     );
  CVar5 = execCompare(compareMode,fVar1,(float)local_a8._0_4_,prec->referenceBits,isFixedPointDepth)
  ;
  CVar6 = execCompare(compareMode,fVar2,(float)local_a8._0_4_,prec->referenceBits,isFixedPointDepth)
  ;
  if ((int)local_88._0_4_ < 1) {
    uVar16 = 0x3f800000;
    if (((((ushort)CVar3 & 1) == 0) && (((ushort)CVar4 & 1) == 0)) && (((ushort)CVar5 & 1) == 0)) {
      if (((ushort)CVar6 & 1) == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0x3f800000;
      }
    }
    local_a8 = ZEXT416(uVar16);
    uVar16 = 0;
    if ((((ushort)((ushort)CVar5 | (ushort)CVar4 | (ushort)CVar3) >> 8 & 1) == 0) &&
       (((ushort)CVar6 >> 8 & 1) == 0)) {
      uVar16 = 0x3f800000;
    }
    local_88 = ZEXT416(uVar16);
    fVar17 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    bVar13 = -(local_78[4] <= (float)local_a8._0_4_ + fVar17 &&
              (float)local_88._0_4_ - fVar17 <= local_78[4]);
  }
  else {
    uVar7 = (ushort)CVar6 >> 5 & 8 |
            (ushort)CVar5 >> 6 & 4 | (ushort)CVar4 >> 7 & 2 | (ushort)CVar3 >> 8 & 1;
    local_88._0_4_ = local_98->m_data[0];
    fVar17 = local_98->m_data[1];
    fVar1 = local_90->m_data[0];
    fVar2 = local_90->m_data[1];
    local_a8._0_4_ = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
    fVar15 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    fVar19 = 1.0 - fVar1;
    fVar18 = 1.0 - fVar2;
    uVar16 = 0;
    bVar13 = true;
    do {
      if (((((ushort)CVar3 & 1) + ((ushort)CVar4 & 1) * 2 + ((ushort)CVar5 & 1) * 4 +
            ((ushort)CVar6 & 1) * 8 ^ uVar7) & uVar16 ^ uVar7) == 0xf) {
        bVar8 = (byte)uVar16;
        local_ac[0] = bVar8 & 1;
        local_ac[1] = bVar8 >> 1 & 1;
        local_ac[2] = bVar8 >> 2 & 1;
        local_a9 = 7 < uVar16;
        lVar9 = 0;
        do {
          local_40[lVar9] = 1.0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        local_58[3] = 0.0;
        local_78[0] = 0.0;
        local_78[1] = 0.0;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        lVar9 = 0;
        pfVar10 = local_40;
        pfVar11 = local_58;
        do {
          pfVar12 = pfVar10;
          if (local_ac[lVar9] == 0) {
            pfVar12 = pfVar11;
          }
          local_78[lVar9] = *pfVar12;
          lVar9 = lVar9 + 1;
          pfVar11 = pfVar11 + 1;
          pfVar10 = pfVar10 + 1;
        } while (lVar9 != 4);
        fVar23 = (1.0 - (float)local_88._0_4_) * local_78[0];
        fVar24 = (1.0 - (float)local_88._0_4_) * local_78[2];
        fVar20 = (float)local_88._0_4_ * local_78[3] * fVar1 +
                 fVar24 * fVar1 + fVar23 * fVar19 + fVar19 * (float)local_88._0_4_ * local_78[1];
        local_78[0] = local_78[0] * (1.0 - fVar17);
        local_78[2] = local_78[2] * (1.0 - fVar17);
        fVar22 = local_78[3] * fVar17 * fVar1 +
                 local_78[2] * fVar1 + local_78[0] * fVar19 + fVar19 * local_78[1] * fVar17;
        fVar21 = (float)local_88._0_4_ * local_78[3] * fVar2 +
                 fVar24 * fVar2 + fVar23 * fVar18 + (float)local_88._0_4_ * local_78[1] * fVar18;
        fVar24 = local_78[3] * fVar17 * fVar2 +
                 local_78[2] * fVar2 + local_78[0] * fVar18 + local_78[1] * fVar17 * fVar18;
        fVar23 = (float)(~-(uint)(fVar21 <= fVar24) & (uint)fVar24 |
                        -(uint)(fVar21 <= fVar24) & (uint)fVar21);
        uVar14 = -(uint)(fVar22 <= fVar23);
        fVar23 = (float)(uVar14 & (uint)fVar22 | ~uVar14 & (uint)fVar23);
        uVar14 = -(uint)(fVar20 <= fVar23);
        if (((float)(uVar14 & (uint)fVar20 | ~uVar14 & (uint)fVar23) -
             (fVar15 + (float)local_a8._0_4_) <= local_78[4]) &&
           (fVar23 = (float)(~-(uint)(fVar24 <= fVar21) & (uint)fVar24 |
                            (uint)fVar21 & -(uint)(fVar24 <= fVar21)),
           uVar14 = -(uint)(fVar23 <= fVar22),
           fVar23 = (float)(uVar14 & (uint)fVar22 | ~uVar14 & (uint)fVar23),
           uVar14 = -(uint)(fVar23 <= fVar20),
           local_78[4] <=
           (float)(uVar14 & (uint)fVar20 | ~uVar14 & (uint)fVar23) + fVar15 + (float)local_a8._0_4_)
           ) break;
      }
      bVar13 = uVar16 < 0xf;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x10);
  }
  return (bool)(bVar13 & 1);
}

Assistant:

static bool isBilinearCompareValid (const Sampler::CompareMode	compareMode,
									const TexComparePrecision&	prec,
									const Vec4&					depths,
									const Vec2&					xBounds,
									const Vec2&					yBounds,
									const float					cmpReference,
									const float					result,
									const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isBilinearPCFCompareValid(compareMode, prec, depths, xBounds, yBounds, cmpReference, result, isFixedPointDepth);
	else
		return isBilinearAnyCompareValid(compareMode, prec, depths, cmpReference, result, isFixedPointDepth);
}